

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

float64 float64_sub_riscv64(float64 a,float64 b,float_status *s)

{
  float64 fVar1;
  
  fVar1 = float64_gen2(a,b,s,hard_f64_sub,soft_f64_sub,f64_is_zon2,f64_addsub_post,(f64_check_fn)0x0
                       ,(soft_f64_op2_fn)0x0);
  return fVar1;
}

Assistant:

float64 QEMU_FLATTEN
float64_sub(float64 a, float64 b, float_status *s)
{
    return float64_addsub(a, b, s, hard_f64_sub, soft_f64_sub);
}